

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwit.h
# Opt level: O1

void __thiscall NaPNSwitcher::~NaPNSwitcher(NaPNSwitcher *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNSwitcher_00175ba8;
  NaPetriCnOutput::~NaPetriCnOutput(&this->out);
  NaPetriCnInput::~NaPetriCnInput(&this->in2);
  NaPetriCnInput::~NaPetriCnInput(&this->in1);
  NaPetriCnInput::~NaPetriCnInput(&this->turn);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

class PNNA_API NaPNSwitcher : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNSwitcher (const char* szNodeName = "switcher");


    ////////////////
    // Connectors //
    ////////////////

    // Control input
    NaPetriCnInput      turn;

    // Input #1 (mainstream)
    NaPetriCnInput      in1;

    // Input #2
    NaPetriCnInput      in2;

    // Output (mainstream)
    NaPetriCnOutput     out;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 7. Do one step of node activity and return true if succeeded
    virtual bool        activate ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

    // 9. Finish data processing by the node (if activate returned true)
    virtual void        post_action ();

}